

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O1

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFission
          (RegisterLiveness *this,Loop *loop,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *moved_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *copied_inst,RegionRegisterLiveness *l1_sim_result,RegionRegisterLiveness *l2_sim_result)

{
  LiveSet *pLVar1;
  uint32_t bb_id;
  IRContext *pIVar2;
  IRContext *this_00;
  mapped_type pBVar3;
  Instruction *pIVar4;
  pointer pOVar5;
  uint **ppuVar6;
  type tVar7;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var8;
  anon_class_8_1_5b1a6210_for_predicate_ this_01;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  int32_t iVar13;
  RegionRegisterLiveness *pRVar14;
  size_type sVar15;
  RegionRegisterLiveness *pRVar16;
  mapped_type *ppBVar17;
  size_type sVar18;
  uint **ppuVar19;
  __hashtable *__h_3;
  _Hash_node_base *p_Var20;
  type tVar21;
  __hashtable *__h;
  anon_class_8_1_5b1a6210_for_predicate_ predicate;
  type tVar22;
  type tVar23;
  Instruction *pIVar24;
  ulong uVar25;
  ulong uVar26;
  pointer pOVar27;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var28;
  DebugScope DVar29;
  __hashtable *__h_2;
  __node_gen_type __node_gen;
  LiveSet *__range2;
  size_t l2_reg_count;
  size_t l1_reg_count;
  Range live_loop;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  __node_gen_type __node_gen_2;
  type local_198;
  type tStack_190;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_188;
  type tStack_180;
  Loop *local_178;
  undefined8 local_170;
  undefined8 auStack_168 [2];
  key_type local_158;
  undefined8 uStack_150;
  code *local_148;
  code *pcStack_140;
  RegionRegisterLiveness *local_138;
  mapped_type local_130;
  ulong local_128;
  ulong local_120;
  type local_118;
  type tStack_110;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_108;
  type tStack_100;
  Loop *local_f8;
  type local_f0;
  type tStack_e8;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_e0;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_d8;
  Loop *local_d0;
  undefined1 local_c8 [24];
  undefined8 uStack_b0;
  IRContext *local_a8;
  uint *local_a0;
  type local_98;
  type tStack_90;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_88;
  type tStack_80;
  Loop *local_78;
  pointer local_70;
  pointer pIStack_68;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  local_60;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  local_48;
  
  predicate.moved_inst = &l1_sim_result->live_in_;
  RegionRegisterLiveness::Clear(l1_sim_result);
  RegionRegisterLiveness::Clear(l2_sim_result);
  pRVar14 = Get(this,loop->loop_header_);
  tVar21 = (type)(pRVar14->live_in_)._M_h._M_before_begin._M_nxt;
  tStack_110 = (type)0x0;
  local_118 = tVar21;
  local_108 = &moved_inst->_M_h;
  tStack_100 = (type)copied_inst;
  local_f8 = loop;
  bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
           ::IsPredicateSatisfied
                     ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                       *)&local_118.__align);
  if ((!bVar10) && (tVar21 != (type)0x0)) {
    do {
      tVar21.__data = *tVar21.__data;
      local_118 = tVar21;
      bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
               ::IsPredicateSatisfied
                         ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                           *)&local_118.__align);
    } while (!bVar10);
  }
  local_f0 = (type)0x0;
  tStack_e8 = (type)0x0;
  local_e0 = moved_inst;
  local_d8 = copied_inst;
  local_d0 = loop;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
  ::IsPredicateSatisfied
            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
              *)&local_f0.__align);
  tVar21 = tStack_110;
  local_78 = local_f8;
  local_88 = local_108;
  tStack_80 = tStack_100;
  local_98 = local_118;
  tStack_90 = tStack_110;
  if (local_118 != (type)0x0 || tStack_110 != (type)0x0) {
    tVar23 = local_118;
    local_198 = (type)l1_sim_result;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l1_sim_result,(size_type *)((long)tVar23 + 8),&local_198);
      if (tVar23 != tVar21) {
        do {
          tVar23.__data = *tVar23.__data;
          local_98 = tVar23;
          bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                   ::IsPredicateSatisfied
                             ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                               *)&local_98.__align);
        } while (!bVar10);
      }
    } while (tVar23 != (type)0x0 || tVar21 != (type)0x0);
  }
  local_98 = (type)(pRVar14->live_in_)._M_h._M_before_begin._M_nxt;
  local_198 = (type)0x0;
  local_138 = l1_sim_result;
  MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
              *)&local_118.__align,(opt *)&local_98.__align,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_198.__align,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,predicate
            );
  MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
              *)&tStack_100.__align,(opt *)&local_198.__align,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_198,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,predicate
            );
  tVar23 = tStack_100;
  p_Var28 = local_108;
  tVar21 = tStack_110;
  uVar25 = (ulong)local_f8 ^ (ulong)tStack_110;
  local_198 = (type)l2_sim_result;
  if (local_118 != tStack_100 || uVar25 != 0) {
    tVar22 = local_118;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l2_sim_result,(size_type *)((long)tVar22 + 8),&local_198);
      if (tVar22 != tVar21) {
        do {
          tVar22.__data = *tVar22.__data;
          if (tVar22 == tVar21) break;
          local_98 = (type)((_Hash_node_base *)((long)tVar22 + 8))->_M_nxt;
          sVar15 = std::
                   _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(p_Var28,(key_type *)&local_98);
        } while (sVar15 != 0);
      }
    } while (tVar22 != tVar23 || uVar25 != 0);
  }
  local_98 = (type)&pIStack_68;
  tStack_90 = (type)0x1;
  local_88 = (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0;
  tStack_80 = (type)0x0;
  local_78 = (Loop *)CONCAT44(local_78._4_4_,0x3f800000);
  local_70 = (pointer)0x0;
  pIStack_68 = (pointer)0x0;
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&local_98.__align);
  pRVar14 = local_138;
  if (local_88 !=
      (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *)0x0) {
    p_Var28 = local_88;
    do {
      pRVar16 = Get(this,*(uint32_t *)&(((pointer)p_Var28)->words)._vptr_SmallVector);
      local_118 = (type)&l2_sim_result->live_out_;
      for (p_Var20 = (pRVar16->live_in_)._M_h._M_before_begin._M_nxt;
          p_Var20 != (_Hash_node_base *)0x0; p_Var20 = p_Var20->_M_nxt) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&l2_sim_result->live_out_,p_Var20 + 1,&local_118);
      }
      p_Var28 = *(_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  **)&((pointer)p_Var28)->type;
    } while (p_Var28 !=
             (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0);
  }
  tVar21 = (type)(l2_sim_result->live_out_)._M_h._M_before_begin._M_nxt;
  tStack_110 = (type)0x0;
  local_118 = tVar21;
  local_108 = &moved_inst->_M_h;
  tStack_100 = (type)copied_inst;
  local_f8 = loop;
  bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
           ::IsPredicateSatisfied
                     ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                       *)&local_118.__align);
  if (tVar21 != (type)0x0 && !bVar10) {
    do {
      tVar21.__data = *tVar21.__data;
      local_118 = tVar21;
      bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
               ::IsPredicateSatisfied
                         ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                           *)&local_118.__align);
    } while (!bVar10);
  }
  local_f0 = (type)0x0;
  tStack_e8 = (type)0x0;
  local_e0 = moved_inst;
  local_d8 = copied_inst;
  local_d0 = loop;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
  ::IsPredicateSatisfied
            ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
              *)&local_f0.__align);
  tVar21 = tStack_110;
  pLVar1 = &pRVar14->live_out_;
  local_178 = local_f8;
  local_188 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               *)local_108;
  tStack_180 = tStack_100;
  local_198 = local_118;
  tStack_190 = tStack_110;
  local_60.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)pLVar1;
  if (local_118 != (type)0x0 || tStack_110 != (type)0x0) {
    tVar23 = local_118;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pLVar1,(_Hash_node_base *)((long)tVar23 + 8),&local_60);
      if (tVar23 != tVar21) {
        do {
          tVar23.__data = *tVar23.__data;
          local_198 = tVar23;
          bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                   ::IsPredicateSatisfied
                             ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                               *)&local_198.__align);
        } while (!bVar10);
      }
    } while (tVar23 != (type)0x0 || tVar21 != (type)0x0);
  }
  tVar21 = (type)(l2_sim_result->live_in_)._M_h._M_before_begin._M_nxt;
  tStack_110 = (type)0x0;
  local_118 = tVar21;
  local_108 = &moved_inst->_M_h;
  tStack_100 = (type)copied_inst;
  local_f8 = loop;
  bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
           ::IsPredicateSatisfied
                     ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                       *)&local_118.__align);
  if (tVar21 != (type)0x0 && !bVar10) {
    do {
      tVar21.__data = *tVar21.__data;
      local_118 = tVar21;
      bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
               ::IsPredicateSatisfied
                         ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                           *)&local_118.__align);
    } while (!bVar10);
  }
  local_f0 = (type)0x0;
  tStack_e8 = (type)0x0;
  local_e0 = moved_inst;
  local_d8 = copied_inst;
  local_d0 = loop;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
  ::IsPredicateSatisfied
            ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
              *)&local_f0.__align);
  tVar21 = tStack_110;
  local_178 = local_f8;
  local_188 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               *)local_108;
  tStack_180 = tStack_100;
  local_198 = local_118;
  tStack_190 = tStack_110;
  local_60.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)pLVar1;
  if (local_118 != (type)0x0 || tStack_110 != (type)0x0) {
    tVar23 = local_118;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pLVar1,(size_type *)((long)tVar23 + 8),&local_60);
      if (tVar23 != tVar21) {
        do {
          tVar23.__data = *tVar23.__data;
          local_198 = tVar23;
          bVar10 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                   ::IsPredicateSatisfied
                             ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                               *)&local_198.__align);
        } while (!bVar10);
      }
    } while (tVar23 != (type)0x0 || tVar21 != (type)0x0);
  }
  pRVar14 = local_138;
  p_Var20 = (local_138->live_out_)._M_h._M_before_begin._M_nxt;
  local_118 = (type)l2_sim_result;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l2_sim_result,p_Var20 + 1,&local_118);
      p_Var20 = p_Var20->_M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  for (p_Var20 = (pRVar14->live_in_)._M_h._M_before_begin._M_nxt; p_Var20 != (_Hash_node_base *)0x0;
      p_Var20 = p_Var20->_M_nxt) {
    RegionRegisterLiveness::AddRegisterClass(pRVar14,(Instruction *)p_Var20[1]._M_nxt);
  }
  for (p_Var20 = (l2_sim_result->live_in_)._M_h._M_before_begin._M_nxt;
      p_Var20 != (_Hash_node_base *)0x0; p_Var20 = p_Var20->_M_nxt) {
    RegionRegisterLiveness::AddRegisterClass(l2_sim_result,(Instruction *)p_Var20[1]._M_nxt);
  }
  pRVar14->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;
  pIVar2 = (IRContext *)(loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  do {
    if (pIVar2 == (IRContext *)0x0) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_98.__align);
      return;
    }
    bb_id = (pIVar2->grammar_).target_env_;
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    local_118._0_4_ = bb_id;
    ppBVar17 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&((this_00->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                        id2block_,(key_type *)local_118.__data);
    pBVar3 = *ppBVar17;
    pRVar14 = Get(this,bb_id);
    if (pRVar14 == (RegionRegisterLiveness *)0x0) {
      __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                    ,0x207,
                    "void spvtools::opt::RegisterLiveness::SimulateFission(const Loop &, const std::unordered_set<Instruction *> &, const std::unordered_set<Instruction *> &, RegionRegisterLiveness *, RegionRegisterLiveness *) const"
                   );
    }
    tVar21 = (type)(pRVar14->live_out_)._M_h._M_before_begin._M_nxt;
    tStack_110 = (type)0x0;
    local_130 = pBVar3;
    local_118 = tVar21;
    local_108 = &moved_inst->_M_h;
    tStack_100 = (type)copied_inst;
    local_f8 = loop;
    local_a8 = pIVar2;
    bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
             ::IsPredicateSatisfied
                       ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                         *)&local_118.__align);
    if ((!bVar10) && (tVar21 != (type)0x0)) {
      do {
        tVar21.__data = *tVar21.__data;
        local_118 = tVar21;
        bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                 ::IsPredicateSatisfied
                           ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                             *)&local_118.__align);
      } while (!bVar10);
    }
    local_f0 = (type)0x0;
    tStack_e8 = (type)0x0;
    local_e0 = moved_inst;
    local_d8 = copied_inst;
    local_d0 = loop;
    FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
    ::IsPredicateSatisfied
              ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                *)&local_f0.__align);
    local_198 = (type)(pRVar14->live_out_)._M_h._M_before_begin._M_nxt;
    local_158 = (Instruction *)0x0;
    MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
              (&local_60,(opt *)&local_198.__align,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_158,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
               predicate);
    MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
              (&local_48,(opt *)&local_158,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_158,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
               predicate);
    tVar7 = tStack_e8;
    tVar22 = local_f0;
    tVar23 = tStack_110;
    tStack_190 = tStack_110;
    local_178 = local_f8;
    local_188 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_108;
    tStack_180 = tStack_100;
    uVar25 = 0;
    tVar21 = local_118;
    while (_Var9.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
                (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
                (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_48.cur_,
          this_01.moved_inst = local_60.predicate_.moved_inst,
          _Var8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
               (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
               (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_60.end_,
          tVar21 != tVar22 || tVar7 != tVar23) {
      if (tVar21 != tVar23) {
        do {
          tVar21.__data = *tVar21.__data;
          local_198 = tVar21;
          bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                   ::IsPredicateSatisfied
                             ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                               *)&local_198.__align);
        } while (!bVar10);
      }
      uVar25 = uVar25 + 1;
    }
    uVar26 = (ulong)local_48.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
                    _M_cur ^
             (ulong)local_60.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
                    _M_cur;
    local_120 = uVar25;
    if (local_60.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
        local_48.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur &&
        uVar26 == 0) {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      DVar29 = (DebugScope)local_60.cur_;
      do {
        if (DVar29 != (DebugScope)
                      _Var8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur) {
          do {
            DVar29 = *(DebugScope *)DVar29;
            if (DVar29 == (DebugScope)
                          _Var8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
                          _M_cur) break;
            local_198 = *(type *)((long)DVar29 + 8);
            sVar15 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&(this_01.moved_inst)->_M_h,(key_type *)&local_198);
          } while (sVar15 != 0);
        }
        uVar25 = uVar25 + 1;
      } while (DVar29 != (DebugScope)
                         _Var9.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur
               || uVar26 != 0);
    }
    local_198 = (type)auStack_168;
    tStack_190 = (type)0x1;
    local_188 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)0x0;
    tStack_180 = (type)0x0;
    local_178 = (Loop *)CONCAT44(local_178._4_4_,0x3f800000);
    local_170 = 0;
    auStack_168[0] = 0;
    pIVar4 = (local_130->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    pIVar24 = &(local_130->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    local_130 = (mapped_type)pIVar4;
    local_128 = uVar25;
    if (pIVar24 != pIVar4) {
      do {
        pIVar4 = (pIVar24->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        if (pIVar4->opcode_ == OpPhi) break;
        local_158 = pIVar4;
        sVar15 = std::
                 _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&moved_inst->_M_h,&local_158);
        bVar10 = true;
        if ((sVar15 == 0) &&
           (sVar15 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&copied_inst->_M_h,&local_158), sVar15 == 0)) {
          bVar10 = Loop::IsInsideLoop(loop,local_158);
          bVar10 = !bVar10;
        }
        local_158 = pIVar4;
        sVar15 = std::
                 _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&moved_inst->_M_h,&local_158);
        local_c8._16_8_ = (Instruction *)0x0;
        uStack_b0._0_1_ = false;
        uStack_b0._1_7_ = 0;
        local_c8._0_8_ = (_func_int **)0x0;
        local_c8._8_8_ = (Instruction *)0x0;
        local_c8._0_8_ = operator_new(0x30);
        *(RegionRegisterLiveness **)local_c8._0_8_ = pRVar14;
        *(type **)(local_c8._0_8_ + 8) = &local_198;
        *(ulong **)(local_c8._0_8_ + 0x10) = &local_120;
        *(ulong **)(local_c8._0_8_ + 0x18) = &local_128;
        *(bool *)(local_c8._0_8_ + 0x20) = bVar10;
        *(bool *)(local_c8._0_8_ + 0x21) = sVar15 == 0;
        *(RegisterLiveness **)(local_c8._0_8_ + 0x28) = this;
        uStack_b0 = std::
                    _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
                    ::_M_invoke;
        local_c8._16_8_ =
             std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
             ::_M_manager;
        uStack_150 = 0;
        local_158 = (key_type)local_c8;
        pcStack_140 = std::
                      _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                      ::_M_invoke;
        local_148 = std::
                    _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                    ::_M_manager;
        pOVar5 = (pIVar4->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar27 = (pIVar4->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar27 != pOVar5;
            pOVar27 = pOVar27 + 1) {
          bVar11 = spvIsInIdType(pOVar27->type);
          if (bVar11) {
            ppuVar6 = (uint **)(pOVar27->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar19 = &(pOVar27->words).small_data_;
            if (ppuVar6 != (uint **)0x0) {
              ppuVar19 = ppuVar6;
            }
            local_a0 = *ppuVar19;
            if (local_148 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar12 = (*pcStack_140)(&local_158,&local_a0);
            if (cVar12 == '\0') break;
          }
        }
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,3);
        }
        pRVar16 = local_138;
        if ((Instruction *)local_c8._16_8_ != (Instruction *)0x0) {
          (*(code *)local_c8._16_8_)(local_c8,local_c8,3);
        }
        uVar25 = local_120;
        if (local_120 < pRVar16->used_registers_) {
          uVar25 = pRVar16->used_registers_;
        }
        pRVar16->used_registers_ = uVar25;
        uVar25 = local_128;
        if (local_128 < l2_sim_result->used_registers_) {
          uVar25 = l2_sim_result->used_registers_;
        }
        l2_sim_result->used_registers_ = uVar25;
        if ((((pIVar4->has_result_id_ == true) && (pIVar4->opcode_ != OpUndef)) &&
            (iVar13 = spvOpcodeIsConstant(pIVar4->opcode_), iVar13 == 0)) &&
           (pIVar4->opcode_ != OpLabel)) {
          if (bVar10 != false) {
            local_158 = pIVar4;
            sVar18 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)pRVar16,&local_158);
            if (sVar18 == 0) {
              RegionRegisterLiveness::AddRegisterClass(pRVar16,pIVar4);
            }
            local_120 = local_120 - 1;
          }
          if (sVar15 == 0) {
            local_158 = pIVar4;
            sVar15 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)l2_sim_result,&local_158);
            if (sVar15 == 0) {
              RegionRegisterLiveness::AddRegisterClass(l2_sim_result,pIVar4);
            }
            local_128 = local_128 - 1;
          }
        }
        pIVar24 = (pIVar24->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      } while ((mapped_type)pIVar24 != local_130);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_198.__align);
    pIVar2 = (IRContext *)local_a8->syntax_context_;
  } while( true );
}

Assistant:

void RegisterLiveness::SimulateFission(
    const Loop& loop, const std::unordered_set<Instruction*>& moved_inst,
    const std::unordered_set<Instruction*>& copied_inst,
    RegionRegisterLiveness* l1_sim_result,
    RegionRegisterLiveness* l2_sim_result) const {
  l1_sim_result->Clear();
  l2_sim_result->Clear();

  // Filter predicates: consider instructions that only belong to the first and
  // second loop.
  auto belong_to_loop1 = [&moved_inst, &copied_inst, &loop](Instruction* insn) {
    return moved_inst.count(insn) || copied_inst.count(insn) ||
           !loop.IsInsideLoop(insn);
  };
  auto belong_to_loop2 = [&moved_inst](Instruction* insn) {
    return !moved_inst.count(insn);
  };

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  // l1 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop1);
    l1_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }
  // l2 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop2);
    l2_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  // l2 live-out.
  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    l2_sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                    live_inout->live_in_.end());
  }
  // l1 live-out.
  {
    auto live_out = MakeFilterIteratorRange(l2_sim_result->live_out_.begin(),
                                            l2_sim_result->live_out_.end(),
                                            belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  {
    auto live_out =
        MakeFilterIteratorRange(l2_sim_result->live_in_.begin(),
                                l2_sim_result->live_in_.end(), belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  // Lives out of l1 are live out of l2 so are live in of l2 as well.
  l2_sim_result->live_in_.insert(l1_sim_result->live_out_.begin(),
                                 l1_sim_result->live_out_.end());

  for (Instruction* insn : l1_sim_result->live_in_) {
    l1_sim_result->AddRegisterClass(insn);
  }
  for (Instruction* insn : l2_sim_result->live_in_) {
    l2_sim_result->AddRegisterClass(insn);
  }

  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegisterLiveness::RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    auto l1_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop1);
    auto l2_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop2);

    size_t l1_reg_count =
        std::distance(l1_block_live_out.begin(), l1_block_live_out.end());
    size_t l2_reg_count =
        std::distance(l2_block_live_out.begin(), l2_block_live_out.end());

    std::unordered_set<uint32_t> die_in_block;
    for (Instruction& insn : make_range(bb->rbegin(), bb->rend())) {
      if (insn.opcode() == spv::Op::OpPhi) {
        break;
      }

      bool does_belong_to_loop1 = belong_to_loop1(&insn);
      bool does_belong_to_loop2 = belong_to_loop2(&insn);
      insn.ForEachInId([live_inout, &die_in_block, &l1_reg_count, &l2_reg_count,
                        does_belong_to_loop1, does_belong_to_loop2,
                        this](uint32_t* id) {
        Instruction* op_insn = context_->get_def_use_mgr()->GetDef(*id);
        if (!CreatesRegisterUsage(op_insn) ||
            live_inout->live_out_.count(op_insn)) {
          // already taken into account.
          return;
        }
        if (!die_in_block.count(*id)) {
          if (does_belong_to_loop1) {
            l1_reg_count++;
          }
          if (does_belong_to_loop2) {
            l2_reg_count++;
          }
          die_in_block.insert(*id);
        }
      });
      l1_sim_result->used_registers_ =
          std::max(l1_sim_result->used_registers_, l1_reg_count);
      l2_sim_result->used_registers_ =
          std::max(l2_sim_result->used_registers_, l2_reg_count);
      if (CreatesRegisterUsage(&insn)) {
        if (does_belong_to_loop1) {
          if (!l1_sim_result->live_in_.count(&insn)) {
            l1_sim_result->AddRegisterClass(&insn);
          }
          l1_reg_count--;
        }
        if (does_belong_to_loop2) {
          if (!l2_sim_result->live_in_.count(&insn)) {
            l2_sim_result->AddRegisterClass(&insn);
          }
          l2_reg_count--;
        }
      }
    }
  }
}